

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

MppBufferGroup dec_buf_mgr_setup(DecBufMgr mgr,RK_U32 size,RK_U32 count,MppDecBufMode mode)

{
  undefined8 uVar1;
  DecBufMgr local_78;
  undefined4 local_68 [2];
  MppBufferInfo commit;
  uint local_38;
  RK_U32 i_1;
  RK_U32 i;
  MPP_RET ret;
  DecBufMgrImpl *impl;
  MppDecBufMode mode_local;
  RK_U32 count_local;
  RK_U32 size_local;
  DecBufMgr mgr_local;
  
  i_1 = 0xffffffff;
  if (mgr == (DecBufMgr)0x0) {
    mgr_local = (DecBufMgr)0x0;
  }
  else {
    if (*(long *)((long)mgr + 0x10) != 0) {
      if (mode == *mgr) {
        mpp_buffer_group_clear(*(undefined8 *)((long)mgr + 0x10));
      }
      else {
        mpp_buffer_group_put(*(undefined8 *)((long)mgr + 0x10));
        *(undefined8 *)((long)mgr + 0x10) = 0;
      }
      if (*(long *)((long)mgr + 0x18) != 0) {
        for (local_38 = 0; local_38 < *(uint *)((long)mgr + 4); local_38 = local_38 + 1) {
          if (*(long *)(*(long *)((long)mgr + 0x18) + (ulong)local_38 * 8) != 0) {
            mpp_buffer_put_with_caller
                      (*(undefined8 *)(*(long *)((long)mgr + 0x18) + (ulong)local_38 * 8),
                       "dec_buf_mgr_setup");
            *(undefined8 *)(*(long *)((long)mgr + 0x18) + (ulong)local_38 * 8) = 0;
          }
        }
        if (*(long *)((long)mgr + 0x18) != 0) {
          mpp_osal_free("dec_buf_mgr_setup",*(undefined8 *)((long)mgr + 0x18));
        }
        *(undefined8 *)((long)mgr + 0x18) = 0;
      }
    }
    if (mode == MPP_DEC_BUF_HALF_INT) {
      if ((*(long *)((long)mgr + 0x10) == 0) &&
         (i_1 = mpp_buffer_group_get((long)mgr + 0x10,1,0,"mpi_dec_utils","dec_buf_mgr_setup"),
         i_1 != 0)) {
        _mpp_log_l(2,"mpi_dec_utils","get mpp internal buffer group failed ret %d\n",
                   "dec_buf_mgr_setup",i_1);
      }
      else {
        i_1 = mpp_buffer_group_limit_config(*(undefined8 *)((long)mgr + 0x10),size,count);
        if (i_1 != 0) {
          _mpp_log_l(2,"mpi_dec_utils","limit buffer group failed ret %d\n","dec_buf_mgr_setup",i_1)
          ;
        }
      }
    }
    else if (mode == MPP_DEC_BUF_INTERNAL) {
      if ((*(long *)((long)mgr + 0x10) != 0) &&
         (_mpp_log_l(2,"mpi_dec_utils","Assertion %s failed at %s:%d\n",0,
                     "((void*)0) == impl->group","dec_buf_mgr_setup",0x365),
         (_mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      i_1 = 0;
    }
    else if (mode == MPP_DEC_BUF_EXTERNAL) {
      uVar1 = mpp_osal_calloc("dec_buf_mgr_setup",(ulong)count << 3);
      *(undefined8 *)((long)mgr + 0x18) = uVar1;
      if (*(long *)((long)mgr + 0x18) == 0) {
        _mpp_log_l(2,"mpi_dec_utils","create %d external buffer record failed\n","dec_buf_mgr_setup"
                   ,count);
      }
      else if ((*(long *)((long)mgr + 0x10) == 0) &&
              (i_1 = mpp_buffer_group_get((long)mgr + 0x10,1,1,"mpi_dec_utils","dec_buf_mgr_setup"),
              i_1 != 0)) {
        _mpp_log_l(2,"mpi_dec_utils","get mpp external buffer group failed ret %d\n",
                   "dec_buf_mgr_setup",i_1);
      }
      else {
        local_68[0] = 1;
        commit._0_8_ = ZEXT48(size);
        for (commit.index = 0; (uint)commit.index < count; commit.index = commit.index + 1) {
          i_1 = mpp_buffer_get_with_tag
                          (0,*(long *)((long)mgr + 0x18) + (ulong)(uint)commit.index * 8,size,
                           "mpi_dec_utils","dec_buf_mgr_setup");
          if ((i_1 != 0) ||
             (*(long *)(*(long *)((long)mgr + 0x18) + (ulong)(uint)commit.index * 8) == 0)) {
            _mpp_log_l(2,"mpi_dec_utils","get misc buffer failed ret %d\n","dec_buf_mgr_setup",i_1);
            break;
          }
          commit.hnd._4_4_ = commit.index;
          commit.size = mpp_buffer_get_ptr_with_caller
                                  (*(undefined8 *)
                                    (*(long *)((long)mgr + 0x18) + (ulong)(uint)commit.index * 8),
                                   "dec_buf_mgr_setup");
          commit.hnd._0_4_ =
               mpp_buffer_get_fd_with_caller
                         (*(undefined8 *)
                           (*(long *)((long)mgr + 0x18) + (ulong)(uint)commit.index * 8),
                          "dec_buf_mgr_setup");
          i_1 = mpp_buffer_import_with_tag
                          (*(undefined8 *)((long)mgr + 0x10),local_68,0,"mpi_dec_utils",
                           "dec_buf_mgr_setup");
          if (i_1 != 0) {
            _mpp_log_l(2,"mpi_dec_utils","external buffer commit failed ret %d\n",
                       "dec_buf_mgr_setup",i_1);
            break;
          }
        }
      }
    }
    else {
      _mpp_log_l(2,"mpi_dec_utils","unsupport buffer mode %d\n","dec_buf_mgr_setup",mode);
    }
    if (i_1 == 0) {
      *(RK_U32 *)((long)mgr + 4) = count;
      *(RK_U32 *)((long)mgr + 8) = size;
      *(MppDecBufMode *)mgr = mode;
      _i = mgr;
    }
    else {
      dec_buf_mgr_deinit(mgr);
      _i = (DecBufMgr)0x0;
    }
    if (_i == (DecBufMgr)0x0) {
      local_78 = (DecBufMgr)0x0;
    }
    else {
      local_78 = *(DecBufMgr *)((long)_i + 0x10);
    }
    mgr_local = local_78;
  }
  return mgr_local;
}

Assistant:

MppBufferGroup dec_buf_mgr_setup(DecBufMgr mgr, RK_U32 size, RK_U32 count, MppDecBufMode mode)
{
    DecBufMgrImpl *impl = (DecBufMgrImpl *)mgr;
    MPP_RET ret = MPP_NOK;

    if (!impl)
        return NULL;

    /* cleanup old buffers if previous buffer group exists */
    if (impl->group) {
        if (mode != impl->buf_mode) {
            /* switch to different buffer mode just release old buffer group */
            mpp_buffer_group_put(impl->group);
            impl->group = NULL;
        } else {
            /* otherwise just cleanup old buffers */
            mpp_buffer_group_clear(impl->group);
        }

        /* if there are external mode old buffers do cleanup */
        if (impl->bufs) {
            RK_U32 i;

            for (i = 0; i < impl->buf_count; i++) {
                if (impl->bufs[i]) {
                    mpp_buffer_put(impl->bufs[i]);
                    impl->bufs[i] = NULL;
                }
            }

            MPP_FREE(impl->bufs);
        }
    }

    switch (mode) {
    case MPP_DEC_BUF_HALF_INT : {
        /* reuse previous half internal buffer group and just reconfig limit */
        if (NULL == impl->group) {
            ret = mpp_buffer_group_get_internal(&impl->group, MPP_BUFFER_TYPE_ION);
            if (ret) {
                mpp_err_f("get mpp internal buffer group failed ret %d\n", ret);
                break;
            }
        }
        /* Use limit config to limit buffer count and buffer size */
        ret = mpp_buffer_group_limit_config(impl->group, size, count);
        if (ret) {
            mpp_err_f("limit buffer group failed ret %d\n", ret);
        }
    } break;
    case MPP_DEC_BUF_INTERNAL : {
        /* do nothing juse keep buffer group empty */
        mpp_assert(NULL == impl->group);
        ret = MPP_OK;
    } break;
    case MPP_DEC_BUF_EXTERNAL : {
        RK_U32 i;
        MppBufferInfo commit;

        impl->bufs = mpp_calloc(MppBuffer, count);
        if (!impl->bufs) {
            mpp_err_f("create %d external buffer record failed\n", count);
            break;
        }

        /* reuse previous external buffer group */
        if (NULL == impl->group) {
            ret = mpp_buffer_group_get_external(&impl->group, MPP_BUFFER_TYPE_ION);
            if (ret) {
                mpp_err_f("get mpp external buffer group failed ret %d\n", ret);
                break;
            }
        }

        /*
         * NOTE: Use default misc allocater here as external allocator for demo.
         * But in practical case the external buffer could be GraphicBuffer or gst dmabuf.
         * The misc allocator will cause the print at the end like:
         * ~MppBufferService cleaning misc group
         */
        commit.type = MPP_BUFFER_TYPE_ION;
        commit.size = size;

        for (i = 0; i < count; i++) {
            ret = mpp_buffer_get(NULL, &impl->bufs[i], size);
            if (ret || NULL == impl->bufs[i]) {
                mpp_err_f("get misc buffer failed ret %d\n", ret);
                break;
            }

            commit.index = i;
            commit.ptr = mpp_buffer_get_ptr(impl->bufs[i]);
            commit.fd = mpp_buffer_get_fd(impl->bufs[i]);

            ret = mpp_buffer_commit(impl->group, &commit);
            if (ret) {
                mpp_err_f("external buffer commit failed ret %d\n", ret);
                break;
            }
        }
    } break;
    default : {
        mpp_err_f("unsupport buffer mode %d\n", mode);
    } break;
    }

    if (ret) {
        dec_buf_mgr_deinit(impl);
        impl = NULL;
    } else {
        impl->buf_count = count;
        impl->buf_size = size;
        impl->buf_mode = mode;
    }

    return impl ? impl->group : NULL;
}